

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::DoIncludeFile
          (FileGenerator *this,string *google3_name,bool do_export,Printer *printer)

{
  long lVar1;
  LogMessage *pLVar2;
  allocator local_112;
  allocator local_111;
  string local_110;
  string local_f0;
  string path;
  string local_98;
  string prefix;
  Formatter format;
  
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  std::__cxx11::string::string((string *)&prefix,"net/proto2/",(allocator *)&path);
  lVar1 = std::__cxx11::string::find((string *)google3_name,(ulong)&prefix);
  if (lVar1 != 0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&path,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_file.cc"
               ,0x143);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)&path,"CHECK failed: google3_name.find(prefix) == 0: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,google3_name);
    internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)&path);
  }
  if ((this->options_).opensource_runtime == true) {
    std::__cxx11::string::substr((ulong)&path,(ulong)google3_name);
    std::__cxx11::string::string((string *)&local_f0,"internal/",&local_111);
    std::__cxx11::string::string((string *)&local_110,"",&local_112);
    StringReplace(&local_98,&path,&local_f0,&local_110,false);
    std::__cxx11::string::operator=((string *)&path,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::string((string *)&local_f0,"proto/",&local_111);
    std::__cxx11::string::string((string *)&local_110,"",&local_112);
    StringReplace(&local_98,&path,&local_f0,&local_110,false);
    std::__cxx11::string::operator=((string *)&path,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::string((string *)&local_f0,"public/",&local_111);
    std::__cxx11::string::string((string *)&local_110,"",&local_112);
    StringReplace(&local_98,&path,&local_f0,&local_110,false);
    std::__cxx11::string::operator=((string *)&path,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    if ((this->options_).runtime_include_base._M_string_length == 0) {
      Formatter::operator()(&format,"#include <google/protobuf/$1$>",&path);
    }
    else {
      Formatter::operator()
                (&format,"#include \"$1$google/protobuf/$2$\"",
                 &(this->options_).runtime_include_base,&path);
    }
    std::__cxx11::string::~string((string *)&path);
  }
  else {
    Formatter::operator()(&format,"#include \"$1$\"",google3_name);
  }
  if (do_export) {
    Formatter::operator()<>(&format,"  // IWYU pragma: export");
  }
  Formatter::operator()<>(&format,"\n");
  std::__cxx11::string::~string((string *)&prefix);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::DoIncludeFile(const std::string& google3_name,
                                  bool do_export, io::Printer* printer) {
  Formatter format(printer, variables_);
  const std::string prefix = "net/proto2/";
  GOOGLE_CHECK(google3_name.find(prefix) == 0) << google3_name;

  if (options_.opensource_runtime) {
    std::string path = google3_name.substr(prefix.size());

    path = StringReplace(path, "internal/", "", false);
    path = StringReplace(path, "proto/", "", false);
    path = StringReplace(path, "public/", "", false);
    if (options_.runtime_include_base.empty()) {
      format("#include <google/protobuf/$1$>", path);
    } else {
      format("#include \"$1$google/protobuf/$2$\"",
             options_.runtime_include_base, path);
    }
  } else {
    format("#include \"$1$\"", google3_name);
  }

  if (do_export) {
    format("  // IWYU pragma: export");
  }

  format("\n");
}